

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O0

BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> * __thiscall
gmlc::containers::
DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::find
          (DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
           *this,GlobalFederateId *searchValue)

{
  bool bVar1;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *in_RDI;
  const_iterator fnd;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *this_00;
  StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>
  *in_stack_ffffffffffffffc0;
  StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>
  *in_stack_ffffffffffffffd0;
  _Node_iterator_base<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false> local_20;
  _Node_iterator_base<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false> local_18 [3];
  
  this_00 = in_RDI;
  local_18[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<helics::GlobalFederateId,_unsigned_long,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>_>
       ::find((unordered_map<helics::GlobalFederateId,_unsigned_long,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>_>
               *)in_RDI,(key_type *)0x495602);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<helics::GlobalFederateId,_unsigned_long,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>_>
       ::end((unordered_map<helics::GlobalFederateId,_unsigned_long,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>_>
              *)in_RDI);
  bVar1 = std::__detail::operator==(local_18,&local_20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
              (in_stack_ffffffffffffffd0);
  }
  else {
    StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::begin
              (in_stack_ffffffffffffffc0);
    std::__detail::
    _Node_const_iterator<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false,_false>::
    operator->((_Node_const_iterator<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false,_false>
                *)0x49564d);
    BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::operator+
              (this_00,(ptrdiff_t *)in_RDI);
  }
  return this_00;
}

Assistant:

auto find(const searchType2& searchValue) const
        {
            auto fnd = lookup2.find(searchValue);
            if (fnd != lookup2.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }